

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_env.cc
# Opt level: O0

Rule * __thiscall BindingEnv::LookupRule(BindingEnv *this,string *rule_name)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_30;
  _Self local_28;
  iterator i;
  string *rule_name_local;
  BindingEnv *this_local;
  
  i._M_node = (_Base_ptr)rule_name;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
       ::find(&this->rules_,rule_name);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
       ::end(&this->rules_);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>
             ::operator->(&local_28);
    this_local = (BindingEnv *)ppVar2->second;
  }
  else if (this->parent_ == (BindingEnv *)0x0) {
    this_local = (BindingEnv *)0x0;
  }
  else {
    this_local = (BindingEnv *)LookupRule(this->parent_,(string *)i._M_node);
  }
  return (Rule *)this_local;
}

Assistant:

const Rule* BindingEnv::LookupRule(const string& rule_name) {
  map<string, const Rule*>::iterator i = rules_.find(rule_name);
  if (i != rules_.end())
    return i->second;
  if (parent_)
    return parent_->LookupRule(rule_name);
  return NULL;
}